

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O2

int __thiscall MeCab::Mmap<char>::open(Mmap<char> *this,char *__file,int __oflag,...)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  wlog wStack_b8;
  stat st;
  
  close(this,(int)__file);
  std::__cxx11::string::string((string *)&st,__file,(allocator *)&wStack_b8);
  std::__cxx11::string::operator=((string *)&this->fileName,(string *)&st);
  std::__cxx11::string::~string((string *)&st);
  if (*___oflag == 'r') {
    if (___oflag[1] == '\0') {
      iVar1 = 0;
    }
    else {
      if ((___oflag[1] != '+') || (___oflag[2] != '\0')) goto LAB_0012d94a;
      iVar1 = 2;
    }
    this->flag = iVar1;
    iVar1 = ::open(__file,iVar1);
    this->fd = iVar1;
    if (iVar1 < 0) {
      wlog::wlog((wlog *)&st,&this->what_);
      poVar2 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                              );
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9c);
      poVar2 = std::operator<<(poVar2,") [");
      poVar2 = std::operator<<(poVar2,"(fd = ::open(filename, flag | O_BINARY)) >= 0");
      poVar2 = std::operator<<(poVar2,"] ");
      pcVar3 = "open failed: ";
    }
    else {
      iVar1 = fstat(iVar1,(stat *)&st);
      if (iVar1 < 0) {
        wlog::wlog(&wStack_b8,&this->what_);
        poVar2 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                                );
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9f);
        poVar2 = std::operator<<(poVar2,") [");
        poVar2 = std::operator<<(poVar2,"::fstat(fd, &st) >= 0");
        poVar2 = std::operator<<(poVar2,"] ");
        pcVar3 = "failed to get file size: ";
      }
      else {
        this->length = st.st_size;
        pcVar3 = (char *)mmap((void *)0x0,st.st_size,(uint)(this->flag == 2) * 2 + 1,1,this->fd,0);
        if (pcVar3 != (char *)0xffffffffffffffff) {
          this->text = pcVar3;
          iVar1 = ::close(this->fd);
          this->fd = -1;
          return (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
        }
        wlog::wlog(&wStack_b8,&this->what_);
        poVar2 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                                );
        poVar2 = std::operator<<(poVar2,"(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xaa);
        poVar2 = std::operator<<(poVar2,") [");
        poVar2 = std::operator<<(poVar2,
                                 "(p = reinterpret_cast<char *> (::mmap(0, length, prot, MAP_SHARED, fd, 0))) != MAP_FAILED"
                                );
        poVar2 = std::operator<<(poVar2,"] ");
        pcVar3 = "mmap() failed: ";
      }
    }
  }
  else {
LAB_0012d94a:
    wlog::wlog((wlog *)&st,&this->what_);
    poVar2 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9a);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"false");
    poVar2 = std::operator<<(poVar2,"] ");
    pcVar3 = "unknown open mode: ";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,__file);
  return 0;
}

Assistant:

bool open(const char *filename, const char *mode = "r") {
    this->close();
    struct stat st;
    fileName = std::string(filename);

    if      (std::strcmp(mode, "r") == 0)
      flag = O_RDONLY;
    else if (std::strcmp(mode, "r+") == 0)
      flag = O_RDWR;
    else
      CHECK_FALSE(false) << "unknown open mode: " << filename;

    CHECK_FALSE((fd = ::open(filename, flag | O_BINARY)) >= 0)
        << "open failed: " << filename;

    CHECK_FALSE(::fstat(fd, &st) >= 0)
        << "failed to get file size: " << filename;

    length = st.st_size;

#ifdef HAVE_MMAP
    int prot = PROT_READ;
    if (flag == O_RDWR) prot |= PROT_WRITE;
    char *p;
    CHECK_FALSE((p = reinterpret_cast<char *>
                 (::mmap(0, length, prot, MAP_SHARED, fd, 0)))
                      != MAP_FAILED)
        << "mmap() failed: " << filename;

    text = reinterpret_cast<T *>(p);
#else
    text = new T[length];
    CHECK_FALSE(::read(fd, text, length) >= 0)
        << "read() failed: " << filename;
#endif
    ::close(fd);
    fd = -1;

    return true;
  }